

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quich.c
# Opt level: O3

void printAll(char *func)

{
  list *plVar1;
  _Bool _Var2;
  char *pcVar3;
  char *str;
  token *ptVar4;
  list *output;
  list *tokens;
  list *local_40;
  list *local_38;
  
  pcVar3 = strtok(func,";");
  if (pcVar3 != (char *)0x0) {
    while( true ) {
      initList(&local_38);
      initList(&local_40);
      str = getResult(pcVar3,local_38,local_40);
      _Var2 = isEmpty(format);
      pcVar3 = format;
      if (!_Var2) {
        strToDouble(str);
        snprintf(str,0x20,pcVar3);
      }
      plVar1 = local_40;
      if (verbose == true) {
        ptVar4 = local_38->first;
        printf("Tokens > ");
        for (; ptVar4 != (token *)0x0; ptVar4 = ptVar4->next) {
          _Var2 = isValid(ptVar4);
          pcVar3 = "\'%s\'? ";
          if (_Var2) {
            pcVar3 = "\'%s\' ";
          }
          printf(pcVar3,ptVar4->value);
        }
        ptVar4 = plVar1->first;
        printf("\nPosfix > ");
        for (; ptVar4 != (token *)0x0; ptVar4 = ptVar4->next) {
          printf("%s ",ptVar4->value);
        }
        printf("\nResult > ");
      }
      if (thousands_sep == true) {
        addThousandsSep(str);
      }
      if (str == (char *)0x0) {
        if (verbose == true) {
          puts("(definition)");
        }
      }
      else {
        puts(str);
        free(str);
      }
      printWarnings(local_40);
      freeList(local_38);
      freeList(local_40);
      pcVar3 = strtok((char *)0x0,";");
      if (pcVar3 == (char *)0x0) break;
      if (verbose == true) {
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

static void printAll(char *func)
{
    char *statements = strtok(func, STMT_SEPARATOR);

    while (statements != NULL) {
        printResult(statements);
        statements = strtok(NULL, STMT_SEPARATOR);

        if (statements != NULL && verbose) {
            printf("\n");
        }
    }
}